

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportInstallFileGenerator::ComplainAboutMissingTarget
          (cmExportInstallFileGenerator *this,cmGeneratorTarget *depender,
          cmGeneratorTarget *dependee,int occurrences)

{
  ostream *poVar1;
  string *psVar2;
  ostringstream *this_00;
  char *pcVar3;
  ostringstream e;
  string local_1c0;
  ostream local_1a0;
  
  this_00 = (ostringstream *)&local_1a0;
  std::__cxx11::ostringstream::ostringstream(this_00);
  poVar1 = std::operator<<((ostream *)this_00,"install(EXPORT \"");
  poVar1 = std::operator<<(poVar1,(string *)&this->IEGen->ExportSet->Name);
  poVar1 = std::operator<<(poVar1,"\" ...) ");
  poVar1 = std::operator<<(poVar1,"includes target \"");
  psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(depender);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  poVar1 = std::operator<<(poVar1,"\" which requires target \"");
  psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(dependee);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  std::operator<<(poVar1,"\" ");
  if (occurrences == 0) {
    pcVar3 = "that is not in the export set.";
  }
  else {
    poVar1 = std::operator<<(&local_1a0,"that is not in this export set, but ");
    this_00 = (ostringstream *)std::ostream::operator<<(poVar1,occurrences);
    pcVar3 = " times in others.";
  }
  std::operator<<((ostream *)this_00,pcVar3);
  std::__cxx11::stringbuf::str();
  cmSystemTools::Error(&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  return;
}

Assistant:

void cmExportInstallFileGenerator::ComplainAboutMissingTarget(
  cmGeneratorTarget* depender, cmGeneratorTarget* dependee, int occurrences)
{
  std::ostringstream e;
  e << "install(EXPORT \"" << this->IEGen->GetExportSet()->GetName()
    << "\" ...) "
    << "includes target \"" << depender->GetName()
    << "\" which requires target \"" << dependee->GetName() << "\" ";
  if (occurrences == 0) {
    e << "that is not in the export set.";
  } else {
    e << "that is not in this export set, but " << occurrences
      << " times in others.";
  }
  cmSystemTools::Error(e.str());
}